

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::DeformableConv2D_x86_avx512::forward
          (DeformableConv2D_x86_avx512 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  Mat *pMVar3;
  size_t _elemsize;
  Mat *this_00;
  _func_int **pp_Var4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  uint _w;
  int iVar10;
  float *pfVar11;
  int *piVar12;
  long lVar13;
  _func_int *p_Var14;
  uint _h;
  int _h_00;
  uint uVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  bool bVar20;
  _func_int **pp_Var21;
  void *pvVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  bool bVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar33;
  float fVar34;
  undefined1 auVar32 [16];
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  ulong local_258;
  ulong local_250;
  Mat local_238;
  ulong local_1f0;
  _func_int *local_1e8;
  int local_1e0;
  int local_1dc;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1d8;
  ulong local_1d0;
  _func_int **local_1c8;
  pointer local_1c0;
  Mat local_1b8;
  Mat *local_168;
  ulong local_160;
  ulong local_158;
  void *local_150;
  long local_148;
  _func_int **local_140;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_138;
  pointer local_130;
  void *local_128;
  void *local_120;
  DeformableConv2D_x86_avx512 *local_118;
  _func_int **local_110;
  Mat local_108;
  Mat local_c0;
  Mat local_78;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_1c0 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  local_1f0 = (ulong)(uint)pMVar3->w;
  iVar1 = pMVar3->h;
  p_Var14 = this->_vptr_DeformableConv2D_x86_avx512[-3];
  iVar2 = pMVar3->c;
  _elemsize = pMVar3->elemsize;
  uVar7 = (long)(~((*(int *)(&this->field_0xd4 + (long)p_Var14) + -1) *
                  *(int *)(&this->field_0xdc + (long)p_Var14)) + pMVar3->w +
                 *(int *)(&this->field_0xec + (long)p_Var14) +
                *(int *)(&this->field_0xf0 + (long)p_Var14)) /
          (long)*(int *)(&this->field_0xe4 + (long)p_Var14);
  local_158 = uVar7 & 0xffffffff;
  iVar10 = (~((*(int *)(&this->field_0xd8 + (long)p_Var14) + -1) *
             *(int *)(&this->field_0xe0 + (long)p_Var14)) + iVar1 +
            *(int *)(&this->field_0xf4 + (long)p_Var14) +
           *(int *)(&this->field_0xf8 + (long)p_Var14)) /
           *(int *)(&this->field_0xe8 + (long)p_Var14);
  _w = (int)uVar7 + 1;
  local_1b8.cstep = 0;
  _h = iVar10 + 1;
  _h_00 = _h * _w;
  local_1b8.data = (void *)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize._0_4_ = 0;
  local_1b8.elemsize._4_4_ = 0;
  local_1b8.elempack = 0;
  local_1b8.allocator = (Allocator *)0x0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_1b8.h = 0;
  local_1b8.d = 0;
  local_1b8.c = 0;
  local_1d8 = top_blobs;
  local_138 = bottom_blobs;
  Mat::create(&local_1b8,
              *(int *)(&this->field_0xd8 + (long)p_Var14) * iVar2 *
              *(int *)(&this->field_0xd4 + (long)p_Var14) * _h_00,_elemsize,opt->blob_allocator);
  iVar18 = -100;
  if ((local_1b8.data != (void *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0)) {
    this_00 = (local_1d8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_00,*(int *)(&this->field_0xd0 +
                                (long)this->_vptr_DeformableConv2D_x86_avx512[-3]),_h_00,_elemsize,
                opt->blob_allocator);
    iVar18 = -100;
    if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      iVar18 = iVar1 * (int)local_1f0;
      local_168 = this_00;
      Mat::reshape(&local_78,pMVar3,iVar18 * iVar2,(Allocator *)0x0);
      Mat::reshape(&local_c0,pMVar3 + 1,pMVar3[1].h * pMVar3[1].w * pMVar3[1].c,(Allocator *)0x0);
      pp_Var4 = this->_vptr_DeformableConv2D_x86_avx512;
      pp_Var21 = pp_Var4;
      if (-1 < iVar10) {
        local_1c0 = (pointer)((long)local_1c0 - (long)pMVar3);
        local_120 = local_78.data;
        local_128 = local_c0.data;
        local_150 = local_1b8.data;
        iVar10 = (int)local_1f0;
        local_1e0 = iVar10 + -1;
        local_1d0 = (ulong)_w;
        local_160 = (ulong)_h;
        auVar28._8_4_ = 0x3f800000;
        auVar28._0_8_ = 0x3f8000003f800000;
        auVar28._12_4_ = 0x3f800000;
        local_258 = 0;
        do {
          if (-1 < (int)local_158) {
            local_148 = local_258 * local_1d0;
            local_1c8 = this->_vptr_DeformableConv2D_x86_avx512;
            p_Var14 = pp_Var4[-3];
            local_250 = 0;
            do {
              if (0 < *(int *)(&this->field_0xd8 + (long)p_Var14)) {
                uVar15 = (uint)local_250;
                auVar8 = vpinsrd_avx(ZEXT416(uVar15),(int)local_258,1);
                auVar29._8_8_ = 0;
                auVar29._0_8_ = *(ulong *)(&this->field_0xe4 + (long)p_Var14);
                auVar29 = vpmulld_avx(auVar29,auVar8);
                auVar8 = vpinsrd_avx(ZEXT416(*(uint *)(&this->field_0xec + (long)p_Var14)),
                                     *(undefined4 *)(&this->field_0xf4 + (long)p_Var14),1);
                auVar8 = vpsubd_avx(auVar29,auVar8);
                pfVar11 = (float *)((long)local_1b8.data +
                                   (long)(int)(((int)local_148 + uVar15) * iVar2 *
                                               *(int *)(&this->field_0xd8 + (long)p_Var14) *
                                              *(int *)(&this->field_0xd4 + (long)p_Var14)) * 4);
                local_110 = this->_vptr_DeformableConv2D_x86_avx512;
                local_1e8 = local_1c8[-3];
                iVar24 = 0;
                do {
                  iVar16 = *(int *)(&this->field_0xd4 + (long)local_1e8);
                  if (0 < iVar16) {
                    local_130 = (local_138->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_start;
                    uVar19 = 0;
                    do {
                      iVar16 = iVar16 * iVar24 + uVar19;
                      fVar30 = 1.0;
                      if (local_1c0 == (pointer)0xd8) {
                        fVar30 = *(float *)((long)local_130[2].data +
                                           local_250 * 4 +
                                           (long)local_130[2].w * local_258 * local_130[2].elemsize
                                           + (long)iVar16 * local_130[2].cstep *
                                             local_130[2].elemsize);
                      }
                      auVar39 = vinsertps_avx(ZEXT416(*(uint *)((long)local_c0.data +
                                                               (long)(int)(((iVar16 * 2 + 1) * _h +
                                                                           (int)local_258) * _w +
                                                                          uVar15) * 4)),
                                              ZEXT416(*(uint *)((long)local_c0.data +
                                                               (long)(int)((iVar16 * 2 * _h +
                                                                           (int)local_258) * _w +
                                                                          uVar15) * 4)),0x10);
                      auVar29 = vpinsrd_avx(ZEXT416(uVar19),iVar24,1);
                      auVar37._8_8_ = 0;
                      auVar37._0_8_ = *(ulong *)(&this->field_0xdc + (long)local_110[-3]);
                      auVar29 = vpmulld_avx(auVar37,auVar29);
                      auVar29 = vpaddd_avx(auVar29,auVar8);
                      auVar29 = vcvtdq2ps_avx(auVar29);
                      auVar32._0_4_ = auVar29._0_4_ + auVar39._0_4_;
                      auVar32._4_4_ = auVar29._4_4_ + auVar39._4_4_;
                      auVar32._8_4_ = auVar29._8_4_ + auVar39._8_4_;
                      auVar32._12_4_ = auVar29._12_4_ + auVar39._12_4_;
                      auVar29 = vmovshdup_avx(auVar32);
                      fVar36 = auVar29._0_4_;
                      if ((float)iVar10 <= auVar32._0_4_ ||
                          (((float)iVar1 <= fVar36 || auVar32._0_4_ <= -1.0) || fVar36 <= -1.0)) {
                        fVar31 = 0.0;
                        fVar33 = 0.0;
                        fVar34 = 0.0;
                        fVar35 = 0.0;
                        auVar39 = ZEXT816(0) << 0x20;
                        bVar27 = false;
                        auVar29 = (undefined1  [16])0x0;
                        bVar9 = false;
                        bVar26 = false;
                        bVar20 = false;
                        lVar25 = 0;
                        lVar17 = 0;
                        lVar13 = 0;
                        lVar23 = 0;
                      }
                      else {
                        auVar29 = vroundps_avx(auVar32,9);
                        auVar38._0_4_ = (uint)auVar29._0_4_;
                        auVar38._4_4_ = (uint)auVar29._4_4_;
                        auVar38._8_4_ = (int)auVar29._8_4_;
                        auVar38._12_4_ = (int)auVar29._12_4_;
                        auVar29 = vcvtdq2ps_avx(auVar38);
                        auVar29 = vsubps_avx(auVar32,auVar29);
                        auVar39 = vsubps_avx(auVar28,auVar29);
                        bVar5 = (int)auVar38._0_4_ < local_1e0;
                        bVar9 = -1 < (int)auVar38._4_4_ && bVar5;
                        bVar6 = (int)auVar38._4_4_ < iVar1 + -1;
                        bVar26 = -1 < (int)auVar38._0_4_ && bVar6;
                        bVar20 = bVar6 && bVar5;
                        bVar27 = -1 < (int)(auVar38._4_4_ | auVar38._0_4_);
                        lVar25 = (long)(int)(iVar10 * auVar38._4_4_ + auVar38._0_4_);
                        if (!bVar27) {
                          lVar25 = 0;
                        }
                        lVar17 = (long)(int)(auVar38._0_4_ + iVar10 * auVar38._4_4_ + 1);
                        if (-1 >= (int)auVar38._4_4_ || !bVar5) {
                          lVar17 = 0;
                        }
                        iVar16 = (auVar38._4_4_ + 1) * iVar10;
                        lVar13 = (long)(int)(auVar38._0_4_ + iVar16);
                        if (-1 >= (int)auVar38._0_4_ || !bVar6) {
                          lVar13 = 0;
                        }
                        lVar23 = (long)(int)(iVar16 + auVar38._0_4_ + 1);
                        if (!bVar6 || !bVar5) {
                          lVar23 = 0;
                        }
                        auVar37 = vblendps_avx(auVar29,auVar39,2);
                        auVar37 = vshufps_avx(auVar37,auVar37,0xe1);
                        fVar31 = auVar39._0_4_ * auVar37._0_4_;
                        fVar33 = auVar39._4_4_ * auVar37._4_4_;
                        fVar34 = auVar39._8_4_ * auVar37._8_4_;
                        fVar35 = auVar39._12_4_ * auVar37._12_4_;
                        auVar37 = vmovshdup_avx(auVar29);
                        auVar39 = ZEXT416((uint)(auVar39._0_4_ * auVar37._0_4_));
                        auVar29 = ZEXT416((uint)(auVar29._0_4_ * auVar37._0_4_));
                      }
                      pvVar22 = local_78.data;
                      iVar16 = iVar2;
                      if (0 < iVar2) {
                        do {
                          auVar37 = ZEXT816(0) << 0x40;
                          if ((float)iVar10 > auVar32._0_4_ &&
                              (((float)iVar1 > fVar36 && auVar32._0_4_ > -1.0) && fVar36 > -1.0)) {
                            auVar38 = ZEXT816(0) << 0x40;
                            auVar40 = ZEXT816(0) << 0x40;
                            if (bVar27) {
                              auVar40 = ZEXT416(*(uint *)((long)pvVar22 + lVar25 * 4));
                            }
                            if (bVar9) {
                              auVar38 = ZEXT416(*(uint *)((long)pvVar22 + lVar17 * 4));
                            }
                            auVar41 = ZEXT816(0) << 0x40;
                            if (bVar26) {
                              auVar37 = ZEXT416(*(uint *)((long)pvVar22 + lVar13 * 4));
                            }
                            if (bVar20) {
                              auVar41 = ZEXT416(*(uint *)((long)pvVar22 + lVar23 * 4));
                            }
                            auVar38 = vinsertps_avx(auVar40,auVar38,0x10);
                            auVar40._0_4_ = auVar38._0_4_ * fVar31;
                            auVar40._4_4_ = auVar38._4_4_ * fVar33;
                            auVar40._8_4_ = auVar38._8_4_ * fVar34;
                            auVar40._12_4_ = auVar38._12_4_ * fVar35;
                            auVar38 = vhaddps_avx(auVar40,auVar40);
                            auVar37 = vfmadd213ss_fma(auVar37,auVar39,auVar38);
                            auVar37 = vfmadd231ss_fma(auVar37,auVar29,auVar41);
                          }
                          *pfVar11 = auVar37._0_4_ * fVar30;
                          pfVar11 = pfVar11 + 1;
                          pvVar22 = (void *)((long)pvVar22 + (long)iVar18 * 4);
                          iVar16 = iVar16 + -1;
                        } while (iVar16 != 0);
                        local_1e8 = local_1c8[-3];
                      }
                      uVar19 = uVar19 + 1;
                      iVar16 = *(int *)(&this->field_0xd4 + (long)local_1e8);
                    } while ((int)uVar19 < iVar16);
                    p_Var14 = pp_Var4[-3];
                    local_1dc = iVar24;
                  }
                  iVar24 = iVar24 + 1;
                } while (iVar24 < *(int *)(&this->field_0xd8 + (long)p_Var14));
              }
              local_250 = local_250 + 1;
            } while (local_250 != local_1d0);
          }
          local_258 = local_258 + 1;
        } while (local_258 != local_160);
        pp_Var21 = this->_vptr_DeformableConv2D_x86_avx512;
        local_140 = pp_Var4;
        local_118 = this;
      }
      Mat::reshape(&local_238,&local_1b8,
                   iVar2 * *(int *)(&this->field_0xd8 + (long)pp_Var21[-3]) *
                   *(int *)(&this->field_0xd4 + (long)pp_Var21[-3]),_h_00,(Allocator *)0x0);
      piVar12 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + 1;
        UNLOCK();
      }
      piVar12 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_1b8.allocator == (Allocator *)0x0) {
            if (local_1b8.data != (void *)0x0) {
              free(local_1b8.data);
            }
          }
          else {
            (*(local_1b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar12 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
      local_1b8.data = local_238.data;
      local_1b8.refcount._0_4_ = local_238.refcount._0_4_;
      local_1b8.refcount._4_4_ = local_238.refcount._4_4_;
      local_1b8.elemsize._0_4_ = (undefined4)local_238.elemsize;
      local_1b8.elemsize._4_4_ = local_238.elemsize._4_4_;
      local_1b8.elempack = local_238.elempack;
      local_1b8.allocator = local_238.allocator;
      local_1b8.dims = local_238.dims;
      local_1b8.w = local_238.w;
      local_1b8.h = local_238.h;
      local_1b8.d = local_238.d;
      local_1b8.c = local_238.c;
      local_1b8.cstep = local_238.cstep;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_238.allocator == (Allocator *)0x0) {
            if (local_238.data != (void *)0x0) {
              free(local_238.data);
            }
          }
          else {
            (*(local_238.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar3 = local_168;
      (*this->inner_product->_vptr_Layer[7])(this->inner_product,&local_1b8,local_168,opt);
      local_238.cstep = 0;
      local_238.data = (void *)0x0;
      local_238.refcount._0_4_ = 0;
      local_238.refcount._4_4_ = 0;
      local_238.elemsize._0_4_ = 0;
      local_238.elemsize._4_4_ = 0;
      local_238.elempack = 0;
      local_238.allocator = (Allocator *)0x0;
      local_238.dims = 0;
      local_238.w = 0;
      local_238.h = 0;
      local_238.d = 0;
      local_238.c = 0;
      (*this->permute->_vptr_Layer[7])(this->permute,pMVar3,&local_238,opt);
      Mat::reshape(&local_108,&local_238,_w,_h,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86_avx512[-3]),
                   (Allocator *)0x0);
      if (local_108.refcount != (int *)0x0) {
        LOCK();
        *local_108.refcount = *local_108.refcount + 1;
        UNLOCK();
      }
      piVar12 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_238.allocator == (Allocator *)0x0) {
            if (local_238.data != (void *)0x0) {
              free(local_238.data);
            }
          }
          else {
            (*(local_238.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_238.data = local_108.data;
      local_238.refcount._0_4_ = SUB84(local_108.refcount,0);
      local_238.refcount._4_4_ = (undefined4)((ulong)local_108.refcount >> 0x20);
      local_238.elemsize._0_4_ = (undefined4)local_108.elemsize;
      local_238.elemsize._4_4_ = (undefined4)(local_108.elemsize >> 0x20);
      local_238.elempack = local_108.elempack;
      local_238.allocator = local_108.allocator;
      local_238.dims = local_108.dims;
      local_238.w = local_108.w;
      local_238.h = local_108.h;
      local_238.d = local_108.d;
      local_238.c = local_108.c;
      local_238.cstep = local_108.cstep;
      if (local_108.refcount != (int *)0x0) {
        LOCK();
        *local_108.refcount = *local_108.refcount + -1;
        UNLOCK();
        if (*local_108.refcount == 0) {
          if (local_108.allocator == (Allocator *)0x0) {
            if (local_108.data != (void *)0x0) {
              free(local_108.data);
            }
          }
          else {
            (*(local_108.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar3 = (local_1d8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar12 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
      if (pMVar3 != &local_238) {
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + 1;
          UNLOCK();
        }
        piVar12 = pMVar3->refcount;
        if (piVar12 != (int *)0x0) {
          LOCK();
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            if (pMVar3->allocator == (Allocator *)0x0) {
              if (pMVar3->data != (void *)0x0) {
                free(pMVar3->data);
              }
            }
            else {
              (*pMVar3->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar3->cstep = 0;
        pMVar3->data = (void *)0x0;
        pMVar3->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar3->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar3->elemsize + 4) = 0;
        pMVar3->dims = 0;
        pMVar3->w = 0;
        pMVar3->h = 0;
        pMVar3->d = 0;
        pMVar3->c = 0;
        piVar12 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
        pMVar3->data = local_238.data;
        pMVar3->refcount = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
        pMVar3->elemsize = CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
        pMVar3->elempack = local_238.elempack;
        pMVar3->allocator = local_238.allocator;
        pMVar3->dims = local_238.dims;
        pMVar3->w = local_238.w;
        pMVar3->h = local_238.h;
        pMVar3->d = local_238.d;
        pMVar3->c = local_238.c;
        pMVar3->cstep = local_238.cstep;
      }
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_238.allocator == (Allocator *)0x0) {
            if (local_238.data != (void *)0x0) {
              free(local_238.data);
            }
          }
          else {
            (*(local_238.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_c0.refcount != (int *)0x0) {
        LOCK();
        *local_c0.refcount = *local_c0.refcount + -1;
        UNLOCK();
        if (*local_c0.refcount == 0) {
          if (local_c0.allocator == (Allocator *)0x0) {
            if (local_c0.data != (void *)0x0) {
              free(local_c0.data);
            }
          }
          else {
            (*(local_c0.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar18 = 0;
    }
  }
  piVar12 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if (local_1b8.data != (void *)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar18;
}

Assistant:

int DeformableConv2D_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& offset = bottom_blobs[1];

    const bool has_mask = (bottom_blobs.size() == 3);

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int in_c = bottom_blob.c;
    const size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int out_w = (w + pad_left + pad_right - kernel_extent_w) / stride_w + 1;
    const int out_h = (h + pad_top + pad_bottom - kernel_extent_h) / stride_h + 1;

    // output = im2col matmul weight_t, im2col.shape is [out_h * out_w, kernel_h * kernel_w * in_c] (in python),
    // weight_t.shape is [num_output, kernel_h * kernel_w * in_c] (in python),
    // output.shape   is [out_h * out_w, num_output] (in python).
    Mat im2col;
    im2col.create(kernel_h * kernel_w * in_c * out_h * out_w, elemsize, opt.blob_allocator);
    if (im2col.empty())
        return -100;

    Mat& output = top_blobs[0];
    output.create(num_output, out_h * out_w, elemsize, opt.blob_allocator);
    if (output.empty())
        return -100;

    Mat bottom_blob_flatten = bottom_blob.reshape(w * h * in_c);
    Mat offset_flatten = offset.reshape(offset.w * offset.h * offset.c);
    const float* data_im_ptr = bottom_blob_flatten;
    const float* data_offset_ptr = offset_flatten;
    float* im2col_ptr = im2col;

    // im2col
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int h_col = 0; h_col < out_h; h_col++)
    {
        for (int w_col = 0; w_col < out_w; w_col++)
        {
            int h_in = h_col * stride_h - pad_top;
            int w_in = w_col * stride_w - pad_left;
            float* data_col_ptr = im2col_ptr + (h_col * out_w + w_col) * kernel_h * kernel_w * in_c;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    const int data_offset_h_ptr = (((i * kernel_w + j) * 2) * out_h + h_col) * out_w + w_col;
                    const int data_offset_w_ptr = (((i * kernel_w + j) * 2 + 1) * out_h + h_col) * out_w + w_col;

                    const float offset_h = data_offset_ptr[data_offset_h_ptr];
                    const float offset_w = data_offset_ptr[data_offset_w_ptr];
                    const float mask_ = has_mask ? bottom_blobs[2].channel(i * kernel_w + j).row(h_col)[w_col] : 1.f;
                    const float h_im = h_in + i * dilation_h + offset_h;
                    const float w_im = w_in + j * dilation_w + offset_w;

                    // Bilinear
                    const bool cond = h_im > -1 && w_im > -1 && h_im < h && w_im < w;
                    float w1 = 0.f;
                    float w2 = 0.f;
                    float w3 = 0.f;
                    float w4 = 0.f;
                    bool v1_cond = false;
                    bool v2_cond = false;
                    bool v3_cond = false;
                    bool v4_cond = false;
                    int v1_pos = 0;
                    int v2_pos = 0;
                    int v3_pos = 0;
                    int v4_pos = 0;
                    if (cond)
                    {
                        int h_low = floor(h_im);
                        int w_low = floor(w_im);
                        int h_high = h_low + 1;
                        int w_high = w_low + 1;

                        float lh = h_im - h_low;
                        float lw = w_im - w_low;
                        float hh = 1 - lh;
                        float hw = 1 - lw;

                        v1_cond = (h_low >= 0 && w_low >= 0);
                        v2_cond = (h_low >= 0 && w_high <= w - 1);
                        v3_cond = (h_high <= h - 1 && w_low >= 0);
                        v4_cond = (h_high <= h - 1 && w_high <= w - 1);
                        if (v1_cond)
                            v1_pos = h_low * w + w_low;
                        if (v2_cond)
                            v2_pos = h_low * w + w_high;
                        if (v3_cond)
                            v3_pos = h_high * w + w_low;
                        if (v4_cond)
                            v4_pos = h_high * w + w_high;

                        w1 = hh * hw;
                        w2 = hh * lw;
                        w3 = lh * hw;
                        w4 = lh * lw;
                    }

                    const float* data_im_channel_ptr = data_im_ptr;
                    for (int c_im = 0; c_im < in_c; c_im++)
                    {
                        float val = 0.f;
                        if (cond)
                        {
                            float v1 = v1_cond ? data_im_channel_ptr[v1_pos] : 0.f;
                            float v2 = v2_cond ? data_im_channel_ptr[v2_pos] : 0.f;
                            float v3 = v3_cond ? data_im_channel_ptr[v3_pos] : 0.f;
                            float v4 = v4_cond ? data_im_channel_ptr[v4_pos] : 0.f;
                            val = w1 * v1 + w2 * v2 + w3 * v3 + w4 * v4;
                        }
                        *data_col_ptr = val * mask_;
                        data_col_ptr += 1;
                        data_im_channel_ptr += h * w;
                    }
                }
            }
        }
    }
    im2col = im2col.reshape(kernel_h * kernel_w * in_c, out_h * out_w);
    // call InnerProduct
    inner_product->forward(im2col, output, opt);
    ncnn::Mat output_t;
    // call Permute
    permute->forward(output, output_t, opt);
    output_t = output_t.reshape(out_w, out_h, num_output);
    top_blobs[0] = output_t;
    return 0;
}